

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_resize_aux(REF_NODE ref_node)

{
  REF_DBL *pRVar1;
  uint uVar2;
  ulong uVar3;
  
  if (ref_node->aux == (REF_DBL *)0x0) {
    uVar2 = ref_node->max * ref_node->naux;
    if ((int)uVar2 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa79,
             "ref_node_resize_aux","malloc ref_node->aux of REF_DBL negative");
      return 1;
    }
    pRVar1 = (REF_DBL *)malloc((ulong)uVar2 << 3);
    ref_node->aux = pRVar1;
    if (pRVar1 != (REF_DBL *)0x0) {
      return 0;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa79,
           "ref_node_resize_aux","malloc ref_node->aux of REF_DBL NULL");
  }
  else {
    fflush(_stdout);
    uVar2 = ref_node->max * ref_node->naux;
    pRVar1 = ref_node->aux;
    if (0 < (int)uVar2) {
      pRVar1 = (REF_DBL *)realloc(pRVar1,(ulong)uVar2 << 3);
      ref_node->aux = pRVar1;
    }
    if (pRVar1 != (REF_DBL *)0x0) {
      return 0;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa7c,
           "ref_node_resize_aux","realloc ref_node->aux NULL");
    uVar3 = (long)ref_node->max * (long)ref_node->naux;
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar3 & 0xffffffff,uVar3,8,
           uVar3 * 8);
  }
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_node_resize_aux(REF_NODE ref_node) {
  if (NULL == ref_node->aux) {
    ref_malloc(ref_node->aux, ref_node_naux(ref_node) * ref_node_max(ref_node),
               REF_DBL);
  } else {
    ref_realloc(ref_node->aux, ref_node_naux(ref_node) * ref_node_max(ref_node),
                REF_DBL);
  }
  return REF_SUCCESS;
}